

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_lib.c
# Opt level: O2

int bn_cmp_words(unsigned_long *a,unsigned_long *b,int n)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  
  uVar1 = a[(long)n + -1];
  uVar3 = b[(long)n + -1];
  if (uVar1 == uVar3) {
    uVar2 = n - 2;
    do {
      if ((int)uVar2 < 0) {
        return 0;
      }
      uVar1 = a[uVar2];
      uVar3 = b[uVar2];
      uVar2 = uVar2 - 1;
    } while (uVar1 == uVar3);
  }
  return (uVar3 < uVar1) - 1 | 1;
}

Assistant:

int bn_cmp_words(const BN_ULONG *a, const BN_ULONG *b, int n)
{
    int i;
    BN_ULONG aa, bb;

    aa = a[n - 1];
    bb = b[n - 1];
    if (aa != bb)
        return ((aa > bb) ? 1 : -1);
    for (i = n - 2; i >= 0; i--) {
        aa = a[i];
        bb = b[i];
        if (aa != bb)
            return ((aa > bb) ? 1 : -1);
    }
    return (0);
}